

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode tool_setopt_mimepost
                   (CURL *curl,GlobalConfig *config,char *name,CURLoption tag,curl_mime *mimepost)

{
  CURLcode CVar1;
  undefined4 in_register_0000000c;
  int *mimeno_00;
  tool_mime *toolmime;
  int mimeno;
  uint local_1c;
  
  mimeno_00 = (int *)CONCAT44(in_register_0000000c,tag);
  CVar1 = curl_easy_setopt(curl,tag,mimepost);
  local_1c = 0;
  if (((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, config->libcurl != (char *)0x0)) &&
     (CVar1 = libcurl_generate_mime
                        (config->current->mimeroot,(GlobalConfig *)&stack0xffffffffffffffe4,toolmime
                         ,mimeno_00), CVar1 == CURLE_OK)) {
    CVar1 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, mime%d);",name,(ulong)local_1c);
    return CVar1;
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt_mimepost(CURL *curl, struct GlobalConfig *config,
                              const char *name, CURLoption tag,
                              curl_mime *mimepost)
{
  CURLcode ret = curl_easy_setopt(curl, tag, mimepost);
  int mimeno = 0;

  if(!ret && config->libcurl) {
    ret = libcurl_generate_mime(curl, config,
                                config->current->mimeroot, &mimeno);

    if(!ret)
      ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, mime%d);",
                         name, mimeno);
  }

  return ret;
}